

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_stream_data_blocked_frame
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  quicly_stream_t *pqVar1;
  quicly_conn_t *in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  quicly_stream_t *stream;
  quicly_conn_t *conn;
  
  pqVar1 = quicly_get_stream(in_RCX,in_RDI + -0x630);
  if ((pqVar1 != (quicly_stream_t *)0x0) &&
     ((pqVar1->_send_aux).max_stream_data == *(uint64_t *)&(in_RCX->super).local.cid_set.plaintext))
  {
    if (in_EDX == 0) {
      if (((*(byte *)(in_RSI + 0x11) >> 1 & 1) != 0) &&
         ((pqVar1->_send_aux).blocked == QUICLY_SENDER_STATE_UNACKED)) {
        (pqVar1->_send_aux).blocked = QUICLY_SENDER_STATE_SEND;
        sched_stream_control((quicly_stream_t *)0x146233);
      }
    }
    else {
      (pqVar1->_send_aux).blocked = QUICLY_SENDER_STATE_ACKED;
    }
  }
  return 0;
}

Assistant:

static int on_ack_stream_data_blocked_frame(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked,
                                            quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_stream_t *stream;

    if ((stream = quicly_get_stream(conn, sent->data.stream_data_blocked.stream_id)) == NULL)
        return 0;

    if (stream->_send_aux.max_stream_data == sent->data.stream_data_blocked.offset) {
        if (acked) {
            stream->_send_aux.blocked = QUICLY_SENDER_STATE_ACKED;
        } else if (packet->frames_in_flight && stream->_send_aux.blocked == QUICLY_SENDER_STATE_UNACKED) {
            stream->_send_aux.blocked = QUICLY_SENDER_STATE_SEND;
            sched_stream_control(stream);
        }
    }

    return 0;
}